

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_readwrite.c
# Opt level: O0

void canvas_addtemplatesforscalar
               (t_symbol *templatesym,t_word *w,int *p_ntemplates,t_symbol ***p_templatevec)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  t_symbol *templatesym_00;
  t_template *ptVar4;
  t_symbol *arraytemplatesym;
  int nitems;
  int elemsize;
  _array *a;
  int j;
  t_template *template;
  t_dataslot *ptStack_30;
  int i;
  t_dataslot *ds;
  t_symbol ***p_templatevec_local;
  int *p_ntemplates_local;
  t_word *w_local;
  t_symbol *templatesym_local;
  
  ptVar4 = template_findbyname(templatesym);
  canvas_doaddtemplate(templatesym,p_ntemplates,p_templatevec);
  if (ptVar4 == (t_template *)0x0) {
    bug("canvas_addtemplatesforscalar");
  }
  else {
    ptStack_30 = ptVar4->t_vec;
    template._4_4_ = ptVar4->t_n;
    p_ntemplates_local = (int *)w;
    while (template._4_4_ != 0) {
      if (ptStack_30->ds_type == 3) {
        piVar3 = *(int **)p_ntemplates_local;
        iVar1 = piVar3[1];
        iVar2 = *piVar3;
        templatesym_00 = ptStack_30->ds_arraytemplate;
        canvas_doaddtemplate(templatesym_00,p_ntemplates,p_templatevec);
        for (a._4_4_ = 0; a._4_4_ < iVar2; a._4_4_ = a._4_4_ + 1) {
          canvas_addtemplatesforscalar
                    (templatesym_00,(t_word *)(*(long *)(piVar3 + 2) + (long)(iVar1 * a._4_4_)),
                     p_ntemplates,p_templatevec);
        }
      }
      ptStack_30 = ptStack_30 + 1;
      p_ntemplates_local = p_ntemplates_local + 2;
      template._4_4_ = template._4_4_ + -1;
    }
  }
  return;
}

Assistant:

static void canvas_addtemplatesforscalar(t_symbol *templatesym,
    t_word *w, int *p_ntemplates, t_symbol ***p_templatevec)
{
    t_dataslot *ds;
    int i;
    t_template *template = template_findbyname(templatesym);
    canvas_doaddtemplate(templatesym, p_ntemplates, p_templatevec);
    if (!template)
        bug("canvas_addtemplatesforscalar");
    else for (ds = template->t_vec, i = template->t_n; i--; ds++, w++)
    {
        if (ds->ds_type == DT_ARRAY)
        {
            int j;
            t_array *a = w->w_array;
            int elemsize = a->a_elemsize, nitems = a->a_n;
            t_symbol *arraytemplatesym = ds->ds_arraytemplate;
            canvas_doaddtemplate(arraytemplatesym, p_ntemplates, p_templatevec);
            for (j = 0; j < nitems; j++)
                canvas_addtemplatesforscalar(arraytemplatesym,
                    (t_word *)(((char *)a->a_vec) + elemsize * j),
                        p_ntemplates, p_templatevec);
        }
    }
}